

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::solveConstraints(btSoftBody *this)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  uint uVar5;
  Link *pLVar6;
  Node *pNVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  code *pcVar10;
  psolver_t p_Var11;
  ulong uVar12;
  int iseq;
  long lVar13;
  int isolve;
  int iVar14;
  int iVar15;
  btVector3 *this_00;
  int iseq_1;
  ulong uVar16;
  btScalar bVar17;
  float fVar18;
  btVector3 bVar19;
  btVector3 ra;
  btMatrix3x3 local_60;
  
  uVar16 = 0;
  applyClusters(this,false);
  uVar5 = (this->m_links).m_size;
  uVar12 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar12 = uVar16;
  }
  for (; uVar12 * 0x48 - uVar16 != 0; uVar16 = uVar16 + 0x48) {
    pLVar6 = (this->m_links).m_data;
    this_00 = (btVector3 *)((long)(pLVar6->m_c3).m_floats + uVar16);
    bVar19 = operator-((btVector3 *)(*(long *)((long)pLVar6->m_n + uVar16 + 8) + 0x20),
                       (btVector3 *)(*(long *)((long)pLVar6->m_n + uVar16) + 0x20));
    *&this_00->m_floats = bVar19.m_floats;
    bVar17 = btVector3::length2(this_00);
    *(float *)((long)(pLVar6->m_c3).m_floats + (uVar16 - 4)) =
         1.0 / (bVar17 * *(float *)((long)(pLVar6->m_c3).m_floats + (uVar16 - 0xc)));
  }
  uVar5 = (this->m_anchors).m_size;
  uVar16 = 0;
  uVar12 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar12 = uVar16;
  }
  for (; uVar12 * 0x68 - uVar16 != 0; uVar16 = uVar16 + 0x68) {
    plVar1 = (long *)((long)(((this->m_anchors).m_data)->m_local).m_floats + (uVar16 - 8));
    ra = operator*((btMatrix3x3 *)(plVar1[3] + 8),(btVector3 *)(plVar1 + 1));
    ImpulseMatrix(&local_60,(this->m_sst).sdt,*(btScalar *)(*plVar1 + 0x60),
                  *(btScalar *)(plVar1[3] + 0x19c),(btMatrix3x3 *)(plVar1[3] + 0x14c),&ra);
    *(undefined8 *)((long)plVar1 + 0x24) = local_60.m_el[0].m_floats._0_8_;
    *(undefined8 *)((long)plVar1 + 0x2c) = local_60.m_el[0].m_floats._8_8_;
    *(undefined8 *)((long)plVar1 + 0x34) = local_60.m_el[1].m_floats._0_8_;
    *(undefined8 *)((long)plVar1 + 0x3c) = local_60.m_el[1].m_floats._8_8_;
    *(undefined8 *)((long)plVar1 + 0x44) = local_60.m_el[2].m_floats._0_8_;
    *(undefined8 *)((long)plVar1 + 0x4c) = local_60.m_el[2].m_floats._8_8_;
    *(undefined8 *)((long)plVar1 + 0x54) = ra.m_floats._0_8_;
    *(undefined8 *)((long)plVar1 + 0x5c) = ra.m_floats._8_8_;
    *(float *)((long)plVar1 + 100) = (this->m_sst).sdt * *(float *)(*plVar1 + 0x60);
    btCollisionObject::activate((btCollisionObject *)plVar1[3],false);
  }
  iVar15 = (this->m_cfg).viterations;
  if (0 < iVar15) {
    for (iVar14 = 0; iVar14 < iVar15; iVar14 = iVar14 + 1) {
      for (lVar13 = 0; lVar13 < (this->m_cfg).m_vsequence.m_size; lVar13 = lVar13 + 1) {
        pcVar10 = VSolve_Links;
        if ((this->m_cfg).m_vsequence.m_data[lVar13] != Linear) {
          pcVar10 = (code *)0x0;
        }
        (*pcVar10)(0x3f800000,this);
      }
      iVar15 = (this->m_cfg).viterations;
    }
    uVar5 = (this->m_nodes).m_size;
    uVar16 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar16;
    }
    for (; uVar12 * 0x78 - uVar16 != 0; uVar16 = uVar16 + 0x78) {
      pNVar7 = (this->m_nodes).m_data;
      local_60.m_el[0] =
           operator*((btVector3 *)((long)(pNVar7->m_v).m_floats + uVar16),&(this->m_sst).sdt);
      bVar19 = operator+((btVector3 *)((long)(pNVar7->m_q).m_floats + uVar16),local_60.m_el);
      *(btScalar (*) [4])((long)(pNVar7->m_x).m_floats + uVar16) = bVar19.m_floats;
    }
  }
  iVar15 = (this->m_cfg).piterations;
  if (0 < iVar15) {
    for (iVar14 = 0; iVar14 < iVar15; iVar14 = iVar14 + 1) {
      for (lVar13 = 0; lVar13 < (this->m_cfg).m_psequence.m_size; lVar13 = lVar13 + 1) {
        p_Var11 = getSolver((this->m_cfg).m_psequence.m_data[lVar13]);
        (*p_Var11)(this,1.0,(float)iVar14 / (float)iVar15);
      }
      iVar15 = (this->m_cfg).piterations;
    }
    fVar18 = (1.0 - (this->m_cfg).kDP) * (this->m_sst).isdt;
    uVar5 = (this->m_nodes).m_size;
    uVar16 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar16;
    }
    for (; uVar12 * 0x78 - uVar16 != 0; uVar16 = uVar16 + 0x78) {
      pNVar7 = (this->m_nodes).m_data;
      bVar19 = operator-((btVector3 *)((long)(pNVar7->m_x).m_floats + uVar16),
                         (btVector3 *)((long)(pNVar7->m_q).m_floats + uVar16));
      auVar8._4_4_ = bVar19.m_floats[1] * fVar18;
      auVar8._0_4_ = bVar19.m_floats[0] * fVar18;
      auVar8._8_4_ = bVar19.m_floats[2] * fVar18;
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])((long)(pNVar7->m_v).m_floats + uVar16) = auVar8;
      *(undefined8 *)((long)(pNVar7->m_f).m_floats + uVar16) = 0;
      *(undefined8 *)((long)(pNVar7->m_f).m_floats + uVar16 + 8) = 0;
    }
  }
  if (0 < (this->m_cfg).diterations) {
    fVar18 = (this->m_cfg).kVCF;
    fVar4 = (this->m_sst).isdt;
    uVar5 = (this->m_nodes).m_size;
    uVar16 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar16;
    }
    for (; uVar12 * 0x78 - uVar16 != 0; uVar16 = uVar16 + 0x78) {
      pNVar7 = (this->m_nodes).m_data;
      puVar2 = (undefined8 *)((long)(pNVar7->m_x).m_floats + uVar16);
      uVar9 = puVar2[1];
      puVar3 = (undefined8 *)((long)(pNVar7->m_q).m_floats + uVar16);
      *puVar3 = *puVar2;
      puVar3[1] = uVar9;
    }
    for (iVar15 = 0; iVar15 < (this->m_cfg).diterations; iVar15 = iVar15 + 1) {
      for (lVar13 = 0; lVar13 < (this->m_cfg).m_dsequence.m_size; lVar13 = lVar13 + 1) {
        p_Var11 = getSolver((this->m_cfg).m_dsequence.m_data[lVar13]);
        (*p_Var11)(this,1.0,0.0);
      }
    }
    fVar18 = fVar18 * fVar4;
    uVar5 = (this->m_nodes).m_size;
    uVar16 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar16;
    }
    for (; uVar12 * 0x78 - uVar16 != 0; uVar16 = uVar16 + 0x78) {
      pNVar7 = (this->m_nodes).m_data;
      bVar19 = operator-((btVector3 *)((long)(pNVar7->m_x).m_floats + uVar16),
                         (btVector3 *)((long)(pNVar7->m_q).m_floats + uVar16));
      local_60.m_el[0].m_floats[1] = bVar19.m_floats[1] * fVar18;
      local_60.m_el[0].m_floats[0] = bVar19.m_floats[0] * fVar18;
      local_60.m_el[0].m_floats[2] = bVar19.m_floats[2] * fVar18;
      local_60.m_el[0].m_floats[3] = 0.0;
      btVector3::operator+=((btVector3 *)((long)(pNVar7->m_v).m_floats + uVar16),local_60.m_el);
    }
  }
  dampClusters(this);
  applyClusters(this,true);
  return;
}

Assistant:

void			btSoftBody::solveConstraints()
{

	/* Apply clusters		*/ 
	applyClusters(false);
	/* Prepare links		*/ 

	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		Link&	l=m_links[i];
		l.m_c3		=	l.m_n[1]->m_q-l.m_n[0]->m_q;
		l.m_c2		=	1/(l.m_c3.length2()*l.m_c0);
	}
	/* Prepare anchors		*/ 
	for(i=0,ni=m_anchors.size();i<ni;++i)
	{
		Anchor&			a=m_anchors[i];
		const btVector3	ra=a.m_body->getWorldTransform().getBasis()*a.m_local;
		a.m_c0	=	ImpulseMatrix(	m_sst.sdt,
			a.m_node->m_im,
			a.m_body->getInvMass(),
			a.m_body->getInvInertiaTensorWorld(),
			ra);
		a.m_c1	=	ra;
		a.m_c2	=	m_sst.sdt*a.m_node->m_im;
		a.m_body->activate();
	}
	/* Solve velocities		*/ 
	if(m_cfg.viterations>0)
	{
		/* Solve			*/ 
		for(int isolve=0;isolve<m_cfg.viterations;++isolve)
		{
			for(int iseq=0;iseq<m_cfg.m_vsequence.size();++iseq)
			{
				getSolver(m_cfg.m_vsequence[iseq])(this,1);
			}
		}
		/* Update			*/ 
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_x	=	n.m_q+n.m_v*m_sst.sdt;
		}
	}
	/* Solve positions		*/ 
	if(m_cfg.piterations>0)
	{
		for(int isolve=0;isolve<m_cfg.piterations;++isolve)
		{
			const btScalar ti=isolve/(btScalar)m_cfg.piterations;
			for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
			{
				getSolver(m_cfg.m_psequence[iseq])(this,1,ti);
			}
		}
		const btScalar	vc=m_sst.isdt*(1-m_cfg.kDP);
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	=	(n.m_x-n.m_q)*vc;
			n.m_f	=	btVector3(0,0,0);		
		}
	}
	/* Solve drift			*/ 
	if(m_cfg.diterations>0)
	{
		const btScalar	vcf=m_cfg.kVCF*m_sst.isdt;
		for(i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_q	=	n.m_x;
		}
		for(int idrift=0;idrift<m_cfg.diterations;++idrift)
		{
			for(int iseq=0;iseq<m_cfg.m_dsequence.size();++iseq)
			{
				getSolver(m_cfg.m_dsequence[iseq])(this,1,0);
			}
		}
		for(int i=0,ni=m_nodes.size();i<ni;++i)
		{
			Node&	n=m_nodes[i];
			n.m_v	+=	(n.m_x-n.m_q)*vcf;
		}
	}
	/* Apply clusters		*/ 
	dampClusters();
	applyClusters(true);
}